

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O0

int nni_lmq_put(nni_lmq *lmq,nng_msg *msg)

{
  size_t sVar1;
  nng_msg *msg_local;
  nni_lmq *lmq_local;
  
  if (lmq->lmq_len < lmq->lmq_cap) {
    sVar1 = lmq->lmq_put;
    lmq->lmq_put = sVar1 + 1;
    lmq->lmq_msgs[sVar1] = msg;
    lmq->lmq_len = lmq->lmq_len + 1;
    lmq->lmq_put = lmq->lmq_mask & lmq->lmq_put;
    lmq_local._4_4_ = 0;
  }
  else {
    lmq_local._4_4_ = 8;
  }
  return lmq_local._4_4_;
}

Assistant:

int
nni_lmq_put(nni_lmq *lmq, nng_msg *msg)
{
	if (lmq->lmq_len >= lmq->lmq_cap) {
		return (NNG_EAGAIN);
	}
	lmq->lmq_msgs[lmq->lmq_put++] = msg;
	lmq->lmq_len++;
	lmq->lmq_put &= lmq->lmq_mask;
	return (0);
}